

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

UInt32 * crnlib::GetMatchesSpec1
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  UInt32 UVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  UInt32 *pUVar6;
  UInt32 *pUVar7;
  bool bVar8;
  UInt32 local_54;
  uint local_50;
  uint local_4c;
  UInt32 *local_48;
  UInt32 *local_38;
  
  local_54 = maxLen;
  local_48 = son + _cyclicBufferPos * 2;
  pUVar6 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  local_4c = 0;
  local_50 = 0;
  do {
    bVar8 = cutValue == 0;
    cutValue = cutValue - 1;
    if ((bVar8) || (uVar4 = pos - curMatch, _cyclicBufferSize <= uVar4)) {
      bVar8 = false;
      *local_48 = 0;
      *pUVar6 = 0;
      local_38 = distances;
    }
    else {
      UVar1 = 0;
      if (_cyclicBufferPos < uVar4) {
        UVar1 = _cyclicBufferSize;
      }
      uVar2 = local_50;
      if (local_4c < local_50) {
        uVar2 = local_4c;
      }
      uVar3 = (ulong)uVar2;
      pUVar7 = son + (UVar1 + (_cyclicBufferPos - uVar4)) * 2;
      if (cur[uVar3 - uVar4] == cur[uVar3]) {
        uVar5 = uVar2 + 1;
        if ((uVar5 != lenLimit) && (cur[(ulong)uVar5 - (ulong)uVar4] == cur[uVar5])) {
          uVar2 = uVar2 + 2;
          do {
            uVar5 = lenLimit;
            if (lenLimit == uVar2) break;
            uVar3 = (ulong)uVar2;
            uVar5 = uVar2;
            uVar2 = uVar2 + 1;
          } while (cur[uVar3 - uVar4] == cur[uVar3]);
        }
        if (local_54 < uVar5) {
          *distances = uVar5;
          distances[1] = uVar4 - 1;
          distances = distances + 2;
          local_54 = uVar5;
          if (uVar5 == lenLimit) {
            *local_48 = *pUVar7;
            *pUVar6 = pUVar7[1];
            bVar8 = false;
            local_38 = distances;
            goto LAB_001a1e96;
          }
        }
        uVar3 = (ulong)uVar5;
      }
      if (cur[uVar3 - uVar4] < cur[uVar3]) {
        *local_48 = curMatch;
        pUVar7 = pUVar7 + 1;
        local_50 = (uint)uVar3;
        local_48 = pUVar7;
      }
      else {
        *pUVar6 = curMatch;
        pUVar6 = pUVar7;
        local_4c = (uint)uVar3;
      }
      curMatch = *pUVar7;
      bVar8 = true;
    }
LAB_001a1e96:
    if (!bVar8) {
      return local_38;
    }
  } while( true );
}

Assistant:

UInt32* GetMatchesSpec1(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                        UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                        UInt32* distances, UInt32 maxLen) {
  CLzRef* ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef* ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize) {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return distances;
    }
    {
      CLzRef* pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte* pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len]) {
        if (++len != lenLimit && pb[len] == cur[len])
          while (++len != lenLimit)
            if (pb[len] != cur[len])
              break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit) {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return distances;
          }
        }
      }
      if (pb[len] < cur[len]) {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      } else {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}